

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>::eval_divide_knuth
          (uintwide_t<8192U,_unsigned_int,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other,
          uintwide_t<24U,_unsigned_char,_void,_false> *remainder)

{
  int_fast8_t iVar1;
  long lVar2;
  local_uint_index_type u_offset;
  unsigned_fast_type u_offset_00;
  unsigned_fast_type v_offset;
  undefined1 auStack_428 [1024];
  
  u_offset_00 = 0;
  for (lVar2 = 0x400; lVar2 != 0; lVar2 = lVar2 + -4) {
    if (*(int *)(this + lVar2 + -4) != 0) goto LAB_0014f81f;
    u_offset_00 = u_offset_00 + 1;
  }
  u_offset_00 = 0x100;
LAB_0014f81f:
  lVar2 = 0x400;
  v_offset = 0;
  do {
    if (lVar2 == 0) {
LAB_0014f89d:
      limits_helper_max<false>();
      memcpy(this,auStack_428,0x400);
      if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
        for (lVar2 = 0; lVar2 != 0x400; lVar2 = lVar2 + 4) {
          *(undefined4 *)((remainder->values).super_array<unsigned_char,_3UL>.elems + lVar2) = 0;
        }
      }
      return;
    }
    if (*(int *)((other->values).super_array<unsigned_char,_3UL>.elems + lVar2 + -4) != 0) {
      if (lVar2 != 0) {
        if (u_offset_00 != 0x100) {
          iVar1 = compare<false,_nullptr>((uintwide_t<24U,_unsigned_char,_void,_false> *)this,other)
          ;
          if (iVar1 != '\0') {
            if (iVar1 != -1) {
              void_math::wide_integer::uintwide_t<8192u,unsigned_int,void,false>::
              eval_divide_knuth_core<8192u>(unsigned_long,unsigned_long,math::wide_integer::
              uintwide_t<8192u,unsigned_int,void,false>const&,math::wide_integer::
              uintwide_t<8192u,unsigned_int,void,false>*,std::
              enable_if<((8192u)>(static_cast<unsigned_int>(std::numeric_limits<unsigned_int>::
              digits))),int>::type__
                        (this,u_offset_00,v_offset,other,remainder,
                         (enable_if_t<(8192U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                          *)0x0);
              return;
            }
            if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
              memcpy(remainder,this,0x400);
            }
            uintwide_t<8192u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
            enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
            value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::
            digits),void>::type__
                      (auStack_428,'\0',
                       (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                        *)0x0);
            goto LAB_0014f910;
          }
          uintwide_t<8192u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
          enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
          value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::
          digits),void>::type__
                    (auStack_428,'\x01',
                     (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                      *)0x0);
          memcpy(this,auStack_428,0x400);
        }
        if (remainder == (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
          return;
        }
        uintwide_t<8192u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
        enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
        value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::
        digits),void>::type__
                  (auStack_428,'\0',
                   (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                    *)0x0);
        this = (uintwide_t<8192U,_unsigned_int,_void,_false> *)remainder;
LAB_0014f910:
        memcpy(this,auStack_428,0x400);
        return;
      }
      goto LAB_0014f89d;
    }
    v_offset = v_offset + 1;
    lVar2 = lVar2 + -4;
  } while( true );
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }